

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O3

void __thiscall QHstsCache::updateFromPolicies(QHstsCache *this,QList<QHstsPolicy> *policies)

{
  bool includeSubDomains;
  QList<QHstsPolicy> *__range1;
  long lVar1;
  QHstsPolicy *policy;
  QHstsPolicy *this_00;
  long in_FS_OFFSET;
  QHstsPolicy QStack_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (policies->d).size;
  if (lVar1 != 0) {
    this_00 = (policies->d).ptr;
    lVar1 = lVar1 << 3;
    do {
      QHstsPolicy::host(&local_50,this_00,(ComponentFormattingOptions)0x7f00000);
      QHstsPolicy::expiry(&QStack_58);
      includeSubDomains = QHstsPolicy::includesSubDomains(this_00);
      updateKnownHost(this,&local_50,(QDateTime *)&QStack_58,includeSubDomains);
      QDateTime::~QDateTime((QDateTime *)&QStack_58);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -8;
    } while (lVar1 != 0);
  }
  if ((this->hstsStore != (QHstsStore *)0x0) && ((policies->d).size != 0)) {
    QHstsStore::synchronize(this->hstsStore);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateFromPolicies(const QList<QHstsPolicy> &policies)
{
    for (const auto &policy : policies)
        updateKnownHost(policy.host(), policy.expiry(), policy.includesSubDomains());

#if QT_CONFIG(settings)
    if (hstsStore && policies.size()) {
        // These policies are coming either from store or from QNAM's setter
        // function. As a result we can notice expired or new policies, time
        // to sync ...
        hstsStore->synchronize();
    }
#endif // QT_CONFIG(settings)
}